

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSignedBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  bool bVar1;
  Newline local_c5;
  Type local_c4;
  StackVar local_bc;
  Type local_b0;
  SignedType local_a8;
  Type local_a0;
  StackVar local_98;
  Type local_8c;
  SignedType local_84;
  Type local_7c;
  StackVar local_74;
  Type local_68;
  Type local_60;
  Type local_58;
  Type type;
  Type result_type;
  char *op_local;
  CWriter *this_local;
  Opcode opcode_local;
  
  result_type = (Type)op;
  this_local._4_4_ = opcode.enum_;
  type = Opcode::GetResultType((Opcode *)((long)&this_local + 4));
  local_58 = Opcode::GetParamType1((Opcode *)((long)&this_local + 4));
  local_60 = Opcode::GetParamType2((Opcode *)((long)&this_local + 4));
  local_68 = local_58;
  bVar1 = wabt::operator==(local_60,local_58);
  if (!bVar1) {
    __assert_fail("opcode.GetParamType2() == type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0x10d6,
                  "void wabt::(anonymous namespace)::CWriter::WriteSignedBinaryExpr(Opcode, const char *)"
                 );
  }
  local_7c = type;
  StackVar::StackVar(&local_74,1,type);
  local_8c = local_58;
  SignedType::SignedType(&local_84,local_58);
  Type::Type(&local_a0,Any);
  StackVar::StackVar(&local_98,1,local_a0);
  local_b0 = local_58;
  SignedType::SignedType(&local_a8,local_58);
  Type::Type(&local_c4,Any);
  StackVar::StackVar(&local_bc,0,local_c4);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[5],wabt::Type&,char_const(&)[4],wabt::(anonymous_namespace)::SignedType,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],char_const*&,char_const(&)[3],wabt::(anonymous_namespace)::SignedType,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_74,(char (*) [5])" = (",&local_58,(char (*) [4])")((",&local_84,
             (char (*) [2])0x238c91,&local_98,(char (*) [2])0x234f67,(char **)&result_type,
             (char (*) [3])0x239ca7,&local_a8,(char (*) [2])0x238c91,&local_bc,
             (char (*) [3])0x239d95,&local_c5);
  DropTypes(this,2);
  PushType(this,type);
  return;
}

Assistant:

void CWriter::WriteSignedBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Type type = opcode.GetParamType1();
  assert(opcode.GetParamType2() == type);
  Write(StackVar(1, result_type), " = (", type, ")((", SignedType(type), ")",
        StackVar(1), " ", op, " (", SignedType(type), ")", StackVar(0), ");",
        Newline());
  DropTypes(2);
  PushType(result_type);
}